

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void __thiscall
clunk::HashEntry::Set
          (HashEntry *this,uint64_t entryKey,Move *bestmove,int eval,int ply,int draft,
          int primaryFlag,int otherFlags)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *__assertion;
  
  if (entryKey == 0) {
    __assertion = "entryKey";
    uVar2 = 0x5e;
  }
  else {
    bVar1 = Move::IsValid(bestmove);
    if (bVar1) {
      uVar2 = -eval;
      if (0 < eval) {
        uVar2 = eval;
      }
      if (uVar2 < 32000) {
        if ((uint)ply < 100) {
          if ((uint)draft < 0x100) {
            if (primaryFlag - 3U < 3) {
              if ((otherFlags & 0xffffffe7U) == 0) {
                this->key = entryKey;
                this->moveBits = bestmove->bits;
                this->depth = (uint8_t)draft;
                this->flags = (byte)otherFlags | (byte)primaryFlag;
                iVar3 = 0;
                if (eval < -31000) {
                  iVar3 = ply;
                }
                iVar3 = -iVar3;
                if (31000 < eval) {
                  iVar3 = ply;
                }
                this->score = (short)iVar3 + (short)eval;
                return;
              }
              __assertion = "!(otherFlags & ~HashEntry::OtherMask)";
              uVar2 = 0x66;
            }
            else {
              __assertion = 
              "(primaryFlag == HashEntry::LowerBound) || (primaryFlag == HashEntry::UpperBound) || (primaryFlag == HashEntry::ExactScore)"
              ;
              uVar2 = 0x65;
            }
          }
          else {
            __assertion = "(draft >= 0) && (draft < 256)";
            uVar2 = 0x62;
          }
        }
        else {
          __assertion = "(ply >= 0) & (ply < MaxPlies)";
          uVar2 = 0x61;
        }
      }
      else {
        __assertion = "abs(eval) < Infinity";
        uVar2 = 0x60;
      }
    }
    else {
      __assertion = "bestmove.IsValid()";
      uVar2 = 0x5f;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                ,uVar2,
                "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
               );
}

Assistant:

void Set(const uint64_t entryKey,
           const Move& bestmove,
           const int eval,
           const int ply,
           const int draft,
           const int primaryFlag,
           const int otherFlags)
  {
    assert(entryKey);
    assert(bestmove.IsValid());
    assert(abs(eval) < Infinity);
    assert((ply >= 0) & (ply < MaxPlies));
    assert((draft >= 0) && (draft < 256));
    assert((primaryFlag == HashEntry::LowerBound) ||
           (primaryFlag == HashEntry::UpperBound) ||
           (primaryFlag == HashEntry::ExactScore));
    assert(!(otherFlags & ~HashEntry::OtherMask));

    key      = entryKey;
    moveBits = bestmove.Bits();
    depth    = static_cast<uint8_t>(draft);
    flags    = static_cast<uint8_t>(primaryFlag | otherFlags);

    // store mate-in-N scores relative to position
    if (eval > MateScore) {
      score  = static_cast<int16_t>(eval + ply);
    }
    else if (eval < -MateScore) {
      score  = static_cast<int16_t>(eval - ply);
    }
    else {
      score  = static_cast<int16_t>(eval);
    }
  }